

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGRULayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  string *psVar2;
  uint64 uVar3;
  Rep *pRVar4;
  bool bVar5;
  bool bVar6;
  GRULayerParams *pGVar7;
  uint64_t uVar8;
  WeightParams *pWVar9;
  void **ppvVar10;
  long lVar11;
  allocator local_10b;
  allocator local_10a;
  char local_109;
  uint64 local_108;
  string local_100;
  string err;
  string local_b0;
  Result r;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypeList;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,2);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar5 = Result::good(&r);
  if (bVar5) {
    validateOutputCount((Result *)&err,layer,2,2);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  bVar5 = Result::good(&r);
  if (bVar5) {
    bVar5 = Result::good(&r);
    if (bVar5) {
      if (this->ndArrayInterpretation != true) {
LAB_00593fe6:
        pGVar7 = Specification::NeuralNetworkLayer::gru(layer);
        bVar5 = pGVar7->hasbiasvectors_;
        weightTypeList.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        weightTypeList.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        weightTypeList.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pWVar9 = pGVar7->updategateweightmatrix_;
        if (pWVar9 == (WeightParams *)0x0) {
          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
        pWVar9 = pGVar7->updategaterecursionmatrix_;
        if (pWVar9 == (WeightParams *)0x0) {
          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
        pWVar9 = pGVar7->resetgateweightmatrix_;
        if (pWVar9 == (WeightParams *)0x0) {
          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
        pWVar9 = pGVar7->resetgaterecursionmatrix_;
        if (pWVar9 == (WeightParams *)0x0) {
          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
        pWVar9 = pGVar7->outputgateweightmatrix_;
        if (pWVar9 == (WeightParams *)0x0) {
          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
        pWVar9 = pGVar7->outputgaterecursionmatrix_;
        if (pWVar9 == (WeightParams *)0x0) {
          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
        std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
        if (bVar5 != false) {
          pWVar9 = pGVar7->updategatebiasvector_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
          std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
          emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
          pWVar9 = pGVar7->resetgatebiasvector_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
          std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
          emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
          pWVar9 = pGVar7->outputgatebiasvector_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          err._M_dataplus._M_p._0_4_ = valueType(pWVar9);
          std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
          emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
        }
        bVar6 = isWeightParamTypeCompatible(&weightTypeList);
        if (bVar6) {
          local_108 = pGVar7->outputvectorsize_;
          pWVar9 = pGVar7->updategateweightmatrix_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          uVar8 = pGVar7->inputvectorsize_ * local_108;
          local_109 = bVar5;
          std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
          psVar2 = (layer->name_).ptr_;
          std::__cxx11::string::string((string *)&local_b0,"update gate weight matrix",&local_10b);
          validateGeneralWeightParams
                    ((Result *)&err,pWVar9,uVar8,local_108,&local_100,psVar2,&local_b0);
          Result::operator=(&r,(Result *)&err);
          std::__cxx11::string::~string((string *)&err._M_string_length);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_100);
          bVar5 = Result::good(&r);
          if (bVar5) {
            pWVar9 = pGVar7->resetgateweightmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
            psVar2 = (layer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_b0,"reset gate weight matrix",&local_10b);
            validateGeneralWeightParams
                      ((Result *)&err,pWVar9,uVar8,local_108,&local_100,psVar2,&local_b0);
            Result::operator=(&r,(Result *)&err);
            std::__cxx11::string::~string((string *)&err._M_string_length);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_100);
            bVar5 = Result::good(&r);
            if (bVar5) {
              pWVar9 = pGVar7->outputgateweightmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
              psVar2 = (layer->name_).ptr_;
              std::__cxx11::string::string
                        ((string *)&local_b0,"output gate weight matrix",&local_10b);
              validateGeneralWeightParams
                        ((Result *)&err,pWVar9,uVar8,local_108,&local_100,psVar2,&local_b0);
              Result::operator=(&r,(Result *)&err);
              std::__cxx11::string::~string((string *)&err._M_string_length);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_100);
              bVar5 = Result::good(&r);
              if (bVar5) {
                pWVar9 = pGVar7->updategaterecursionmatrix_;
                if (pWVar9 == (WeightParams *)0x0) {
                  pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                uVar3 = pGVar7->outputvectorsize_;
                std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
                psVar2 = (layer->name_).ptr_;
                std::__cxx11::string::string
                          ((string *)&local_b0,"update gate recursion matrix",&local_10b);
                uVar8 = uVar3 * uVar3;
                validateGeneralWeightParams
                          ((Result *)&err,pWVar9,uVar8,local_108,&local_100,psVar2,&local_b0);
                Result::operator=(&r,(Result *)&err);
                std::__cxx11::string::~string((string *)&err._M_string_length);
                std::__cxx11::string::~string((string *)&local_b0);
                std::__cxx11::string::~string((string *)&local_100);
                bVar5 = Result::good(&r);
                if (bVar5) {
                  pWVar9 = pGVar7->resetgaterecursionmatrix_;
                  if (pWVar9 == (WeightParams *)0x0) {
                    pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
                  psVar2 = (layer->name_).ptr_;
                  std::__cxx11::string::string
                            ((string *)&local_b0,"reset gate recursion matrix",&local_10b);
                  validateGeneralWeightParams
                            ((Result *)&err,pWVar9,uVar8,local_108,&local_100,psVar2,&local_b0);
                  Result::operator=(&r,(Result *)&err);
                  std::__cxx11::string::~string((string *)&err._M_string_length);
                  std::__cxx11::string::~string((string *)&local_b0);
                  std::__cxx11::string::~string((string *)&local_100);
                  bVar5 = Result::good(&r);
                  if (bVar5) {
                    pWVar9 = pGVar7->outputgaterecursionmatrix_;
                    if (pWVar9 == (WeightParams *)0x0) {
                      pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                    }
                    std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
                    psVar2 = (layer->name_).ptr_;
                    std::__cxx11::string::string
                              ((string *)&local_b0,"output gate recursion matrix",&local_10b);
                    validateGeneralWeightParams
                              ((Result *)&err,pWVar9,uVar8,local_108,&local_100,psVar2,&local_b0);
                    Result::operator=(&r,(Result *)&err);
                    std::__cxx11::string::~string((string *)&err._M_string_length);
                    std::__cxx11::string::~string((string *)&local_b0);
                    std::__cxx11::string::~string((string *)&local_100);
                    bVar5 = Result::good(&r);
                    if (bVar5) {
                      if (local_109 == '\0') {
LAB_005947c2:
                        pRVar4 = (pGVar7->activations_).super_RepeatedPtrFieldBase.rep_;
                        ppvVar10 = pRVar4->elements;
                        if (pRVar4 == (Rep *)0x0) {
                          ppvVar10 = (void **)0x0;
                        }
                        iVar1 = (pGVar7->activations_).super_RepeatedPtrFieldBase.current_size_;
                        lVar11 = 0;
                        do {
                          if ((long)iVar1 * 8 == lVar11) break;
                          validateRecurrentActivationParams
                                    ((Result *)&err,*(ActivationParams **)((long)ppvVar10 + lVar11))
                          ;
                          Result::operator=(&r,(Result *)&err);
                          std::__cxx11::string::~string((string *)&err._M_string_length);
                          bVar5 = Result::good(&r);
                          lVar11 = lVar11 + 8;
                        } while (bVar5);
                      }
                      else {
                        pWVar9 = pGVar7->updategatebiasvector_;
                        if (pWVar9 == (WeightParams *)0x0) {
                          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                        }
                        local_108 = pGVar7->outputvectorsize_;
                        std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
                        psVar2 = (layer->name_).ptr_;
                        std::__cxx11::string::string
                                  ((string *)&local_b0,"update gate bias vector",&local_10b);
                        validateGeneralWeightParams
                                  ((Result *)&err,pWVar9,local_108,1,&local_100,psVar2,&local_b0);
                        Result::operator=(&r,(Result *)&err);
                        std::__cxx11::string::~string((string *)&err._M_string_length);
                        std::__cxx11::string::~string((string *)&local_b0);
                        std::__cxx11::string::~string((string *)&local_100);
                        bVar5 = Result::good(&r);
                        if (bVar5) {
                          pWVar9 = pGVar7->resetgatebiasvector_;
                          if (pWVar9 == (WeightParams *)0x0) {
                            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_
                            ;
                          }
                          std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
                          psVar2 = (layer->name_).ptr_;
                          std::__cxx11::string::string
                                    ((string *)&local_b0,"reset gate bias vector",&local_10b);
                          validateGeneralWeightParams
                                    ((Result *)&err,pWVar9,local_108,1,&local_100,psVar2,&local_b0);
                          Result::operator=(&r,(Result *)&err);
                          std::__cxx11::string::~string((string *)&err._M_string_length);
                          std::__cxx11::string::~string((string *)&local_b0);
                          std::__cxx11::string::~string((string *)&local_100);
                          bVar5 = Result::good(&r);
                          if (bVar5) {
                            pWVar9 = pGVar7->outputgatebiasvector_;
                            if (pWVar9 == (WeightParams *)0x0) {
                              pWVar9 = (WeightParams *)
                                       &Specification::_WeightParams_default_instance_;
                            }
                            std::__cxx11::string::string((string *)&local_100,"GRU",&local_10a);
                            psVar2 = (layer->name_).ptr_;
                            std::__cxx11::string::string
                                      ((string *)&local_b0,"output gate bias vector",&local_10b);
                            validateGeneralWeightParams
                                      ((Result *)&err,pWVar9,local_108,1,&local_100,psVar2,&local_b0
                                      );
                            Result::operator=(&r,(Result *)&err);
                            std::__cxx11::string::~string((string *)&err._M_string_length);
                            std::__cxx11::string::~string((string *)&local_b0);
                            std::__cxx11::string::~string((string *)&local_100);
                            bVar5 = Result::good(&r);
                            if (bVar5) goto LAB_005947c2;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          Result::Result(__return_storage_ptr__,&r);
        }
        else {
          std::operator+(&local_100,"GRU layer \'",(layer->name_).ptr_);
          std::operator+(&err,&local_100,
                         "\' has invalid weight/recursion matrix or bias fields. Field value types should match and should be either half or full precision"
                        );
          std::__cxx11::string::~string((string *)&local_100);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          std::__cxx11::string::~string((string *)&err);
        }
        std::_Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
        ~_Vector_base(&weightTypeList.
                       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                     );
        goto LAB_00594845;
      }
      std::__cxx11::string::string((string *)&local_50,"GRU",(allocator *)&local_100);
      validateInputOutputRankEquality((Result *)&err,layer,&local_50,&this->blobNameToRank);
      Result::operator=(&r,(Result *)&err);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      std::__cxx11::string::~string((string *)&local_50);
      bVar5 = Result::good(&r);
      if (bVar5) {
        std::__cxx11::string::string((string *)&local_100,"GRU",(allocator *)&local_b0);
        validateRankCount((Result *)&err,layer,&local_100,5,5,&this->blobNameToRank);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&local_100);
        bVar5 = Result::good(&r);
        if (bVar5) goto LAB_00593fe6;
      }
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_00594845:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGRULayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;

    // Must specify hidden states
    r = validateInputCount(layer, 1, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 2, 2);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "GRU", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "GRU", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.gru();
    bool hasBiasVectors = params.hasbiasvectors();

    std::vector<CoreML::WeightParamType> weightTypeList;
    weightTypeList.push_back(valueType(params.updategateweightmatrix()));
    weightTypeList.push_back(valueType(params.updategaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.resetgateweightmatrix()));
    weightTypeList.push_back(valueType(params.resetgaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.outputgateweightmatrix()));
    weightTypeList.push_back(valueType(params.outputgaterecursionmatrix()));
    if(hasBiasVectors){
        weightTypeList.push_back(valueType(params.updategatebiasvector()));
        weightTypeList.push_back(valueType(params.resetgatebiasvector()));
        weightTypeList.push_back(valueType(params.outputgatebiasvector()));
    }
    if(!isWeightParamTypeCompatible(weightTypeList)){
        const std::string err = "GRU layer '" + layer.name() + "' has invalid weight/recursion matrix or bias fields. "
        "Field value types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // allen-continue


    // Check the size of the input matrices
    const uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    const uint64_t outSize = params.outputvectorsize();
    r = validateGeneralWeightParams(params.updategateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "update gate weight matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.resetgateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "reset gate weight matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.outputgateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "output gate weight matrix");
    if (!r.good()) return r;

    // Check the size of the recurrent matrices
    const uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.updategaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "update gate recursion matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.resetgaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "reset gate recursion matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.outputgaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "output gate recursion matrix");
    if (!r.good()) return r;

    if (hasBiasVectors){
        const uint64_t bias_size = params.outputvectorsize();
        r = validateGeneralWeightParams(params.updategatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "update gate bias vector");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(params.resetgatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "reset gate bias vector");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(params.outputgatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "output gate bias vector");
        if (!r.good()) return r;
    }

    // Now check the activations
    for (const auto& activation : params.activations()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }
    return r;
}